

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> __thiscall
enact::Parser::expectBlock(Parser *this,string *msg)

{
  int iVar1;
  ParseError *__return_storage_ptr__;
  string *in_RDX;
  CompileContext *local_20;
  
  iVar1 = *(int *)&msg[7]._M_dataplus._M_p;
  if ((iVar1 != 2) && (iVar1 != 0x18)) {
    __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
    errorAtCurrent(__return_storage_ptr__,(Parser *)msg,in_RDX);
    __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error);
  }
  advance((Parser *)msg);
  parseBlockExpr((Parser *)&stack0xffffffffffffffe0);
  this->m_context = local_20;
  return (__uniq_ptr_data<enact::BlockExpr,_std::default_delete<enact::BlockExpr>,_true,_true>)
         (__uniq_ptr_data<enact::BlockExpr,_std::default_delete<enact::BlockExpr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<BlockExpr> Parser::expectBlock(const std::string &msg) {
        if (!consume(TokenType::EQUAL_GREATER) && !consume(TokenType::LEFT_BRACE)) {
            throw errorAtCurrent(msg);
        }
        return static_unique_ptr_cast<BlockExpr>(parseBlockExpr());
    }